

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_GlobalSymbolStream.cpp
# Opt level: O1

Record * __thiscall
PDB::GlobalSymbolStream::GetRecord
          (GlobalSymbolStream *this,CoalescedMSFStream *symbolRecordStream,HashRecord *hashRecord)

{
  return (Record *)(symbolRecordStream->m_data + (hashRecord->offset - 1));
}

Assistant:

PDB_NO_DISCARD const PDB::CodeView::DBI::Record* PDB::GlobalSymbolStream::GetRecord(const CoalescedMSFStream& symbolRecordStream, const HashRecord& hashRecord) const PDB_NO_EXCEPT
{
	// hash record offsets start at 1, not at 0
	const uint32_t headerOffset = hashRecord.offset - 1u;

	// the offset doesn't point to the global symbol directly, but to the CodeView record:
	// https://llvm.org/docs/PDB/CodeViewSymbols.html
	const CodeView::DBI::Record* record = symbolRecordStream.GetDataAtOffset<const CodeView::DBI::Record>(headerOffset);

	return record;
}